

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

FloatParts pick_nan(FloatParts a,FloatParts b,float_status *s)

{
  int iVar1;
  bool aIsLargerSignificand;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  FloatParts FVar6;
  
  uVar3 = b._8_8_;
  uVar2 = b.frac;
  uVar4 = a.frac;
  if ((uVar3 & 0xff00000000) == 0x500000000 || a.cls == float_class_snan) {
    s->float_exception_flags = s->float_exception_flags | 1;
  }
  uVar5 = 0x2000000000000000;
  if (s->default_nan_mode == '\0') {
    aIsLargerSignificand = true;
    if (uVar4 <= uVar2) {
      if (uVar4 == uVar2) {
        aIsLargerSignificand = (a._12_4_ >> 8 & 1) < (uint)((uVar3 >> 0x28 & 1) != 0);
      }
      else {
        aIsLargerSignificand = false;
      }
    }
    iVar1 = pickNaN(a.cls,b.cls,aIsLargerSignificand);
    uVar5 = uVar2;
    if (iVar1 == 0) {
      uVar3 = a._8_8_;
      uVar5 = uVar4;
    }
    if ((uVar3 & 0xff00000000) == 0x500000000) {
      uVar3 = uVar3 & 0xffffff04ffffffff;
      uVar5 = uVar5 | 0x2000000000000000;
    }
  }
  else {
    uVar3 = 0x47fffffff;
  }
  FVar6.exp = (int)uVar3;
  FVar6.cls = (char)(uVar3 >> 0x20);
  FVar6.sign = (_Bool)(char)(uVar3 >> 0x28);
  FVar6._14_2_ = (short)(uVar3 >> 0x30);
  FVar6.frac = uVar5;
  return FVar6;
}

Assistant:

static FloatParts pick_nan(FloatParts a, FloatParts b, float_status *s)
{
    if (is_snan(a.cls) || is_snan(b.cls)) {
        s->float_exception_flags |= float_flag_invalid;
    }

    if (s->default_nan_mode) {
        return parts_default_nan(s);
    } else {
        if (pickNaN(a.cls, b.cls,
                    a.frac > b.frac ||
                    (a.frac == b.frac && a.sign < b.sign))) {
            a = b;
        }
        if (is_snan(a.cls)) {
            return parts_silence_nan(a, s);
        }
    }
    return a;
}